

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O1

bool google::protobuf::internal::InternalPackFrom
               (Message *message,UrlType *dst_url,ValueType *dst_value)

{
  bool bVar1;
  size_t sVar2;
  string_view type_url_prefix;
  string_view type_name;
  GetTypeNameReturnType local_50;
  
  sVar2 = strlen("type.googleapis.com/");
  MessageLite::GetTypeName_abi_cxx11_(&local_50,&message->super_MessageLite);
  type_url_prefix._M_str = "type.googleapis.com/";
  type_url_prefix._M_len = sVar2;
  type_name._M_str = local_50._M_dataplus._M_p;
  type_name._M_len = local_50._M_string_length;
  bVar1 = InternalPackFromLite
                    (&message->super_MessageLite,type_url_prefix,type_name,dst_url,dst_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool InternalPackFrom(const Message& message, UrlType* dst_url,
                      ValueType* dst_value) {
  return InternalPackFromLite(message, kTypeGoogleApisComPrefix,
                              message.GetTypeName(), dst_url, dst_value);
}